

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O0

unsigned_long strchrcount(char *haystack,char needle)

{
  unsigned_long i;
  char needle_local;
  char *haystack_local;
  unsigned_long local_8;
  
  i = 0;
  haystack_local = haystack;
  if (haystack == (char *)0x0) {
    local_8 = 0;
  }
  else {
    for (; *haystack_local != '\0'; haystack_local = haystack_local + 1) {
      if (*haystack_local == needle) {
        i = i + 1;
      }
    }
    local_8 = i;
  }
  return local_8;
}

Assistant:

unsigned long strchrcount(char * haystack, char needle)
{
	unsigned long       i=0;

	if(!haystack)
		return 0;

	while(*haystack)
	{
		if(*haystack==needle)
			i++;

		haystack++;
	}

	return i;
}